

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

int __thiscall
ON_BinaryArchive::Read3dmInstanceDefinition
          (ON_BinaryArchive *this,ON_InstanceDefinition **ppInstanceDefinition)

{
  bool bVar1;
  int iVar2;
  ON_Object *local_40;
  ON_Object *p;
  ON_InstanceDefinition *idef;
  ON__INT64 big_value;
  ON_InstanceDefinition **ppOStack_20;
  ON__UINT32 tcode;
  ON_InstanceDefinition **ppInstanceDefinition_local;
  ON_BinaryArchive *this_local;
  
  ppOStack_20 = ppInstanceDefinition;
  ppInstanceDefinition_local = (ON_InstanceDefinition **)this;
  bVar1 = Read3dmTableRecord(this,instance_definition_table,ppInstanceDefinition);
  if (bVar1) {
    big_value._4_4_ = 0;
    idef = (ON_InstanceDefinition *)0x0;
    p = (ON_Object *)0x0;
    bVar1 = BeginRead3dmBigChunk(this,(uint *)((long)&big_value + 4),(ON__INT64 *)&idef);
    if (bVar1) {
      if (big_value._4_4_ == 0x20008076) {
        Internal_Increment3dmTableItemCount(this);
        local_40 = (ON_Object *)0x0;
        iVar2 = ReadObject(this,&local_40);
        if (((iVar2 != 0) &&
            (p = (ON_Object *)ON_InstanceDefinition::Cast(local_40),
            (ON_InstanceDefinition *)p == (ON_InstanceDefinition *)0x0)) &&
           (local_40 != (ON_Object *)0x0)) {
          (*local_40->_vptr_ON_Object[4])();
        }
        if (p == (ON_Object *)0x0) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x2e32,"",
                     "ON_BinaryArchive::Read3dmInstanceDefinition() - corrupt instance definition table"
                    );
        }
      }
      else if (big_value._4_4_ != -1) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x2e36,"",
                   "ON_BinaryArchive::Read3dmInstanceDefinition() - corrupt instance definition table"
                  );
      }
      EndRead3dmChunk(this);
    }
    if (p != (ON_Object *)0x0) {
      Internal_Read3dmUpdateManifest(this,(ON_ModelComponent *)p);
    }
    *ppOStack_20 = (ON_InstanceDefinition *)p;
    this_local._4_4_ = (uint)(p != (ON_Object *)0x0);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int ON_BinaryArchive::Read3dmInstanceDefinition( ON_InstanceDefinition** ppInstanceDefinition )
{
  if ( false == Read3dmTableRecord(ON_3dmArchiveTableType::instance_definition_table, (void**)ppInstanceDefinition))
    return 0;

  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  ON_InstanceDefinition* idef = nullptr;
  if ( BeginRead3dmBigChunk( &tcode, &big_value ) ) 
  {
    if ( tcode == TCODE_INSTANCE_DEFINITION_RECORD )
    {
      Internal_Increment3dmTableItemCount();
      ON_Object* p = 0;
      if ( ReadObject( &p ) ) {
        idef = ON_InstanceDefinition::Cast(p);
        if ( !idef )
          delete p;
      }
      if (!idef) {
        ON_ERROR("ON_BinaryArchive::Read3dmInstanceDefinition() - corrupt instance definition table");
      }
    }
    else if ( tcode != TCODE_ENDOFTABLE ) {
      ON_ERROR("ON_BinaryArchive::Read3dmInstanceDefinition() - corrupt instance definition table");
    }
    EndRead3dmChunk();
  }
  if (idef)
  {
    Internal_Read3dmUpdateManifest(*idef);
  }
  *ppInstanceDefinition = idef;
  return (idef) ? 1 : 0;
}